

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

const_iterator __thiscall
frozen::set<short,_1UL,_std::less<short>_>::lower_bound<int>
          (set<short,_1UL,_std::less<short>_> *this,int *key)

{
  short *value;
  bool bVar1;
  const_iterator first;
  key_compare *pkVar2;
  set<short,_1UL,_std::less<short>_> *psVar3;
  set<short,_1UL,_std::less<short>_> *psVar4;
  byte local_2b;
  short local_2a;
  set<short,_1UL,_std::less<short>_> *local_28;
  short *where;
  int *key_local;
  set<short,_1UL,_std::less<short>_> *this_local;
  
  where = (short *)key;
  key_local = (int *)this;
  first = bits::carray<short,_1UL>::begin(&this->keys_);
  value = where;
  pkVar2 = value_comp(this);
  psVar3 = (set<short,_1UL,_std::less<short>_> *)
           bits::lower_bound<1ul,short_const*,int,std::less<short>>(first,(int *)value,pkVar2);
  local_28 = psVar3;
  psVar4 = (set<short,_1UL,_std::less<short>_> *)end(this);
  local_2b = 0;
  if (psVar3 != psVar4) {
    pkVar2 = value_comp(this);
    local_2a = (short)*(undefined4 *)where;
    bVar1 = std::less<short>::operator()(pkVar2,&local_2a,(short *)local_28);
    local_2b = bVar1 ^ 0xff;
  }
  if ((local_2b & 1) == 0) {
    this_local = (set<short,_1UL,_std::less<short>_> *)end(this);
  }
  else {
    this_local = local_28;
  }
  return (const_iterator)this_local;
}

Assistant:

constexpr const_iterator lower_bound(KeyType const &key) const {
    auto const where = bits::lower_bound<N>(keys_.begin(), key, value_comp());
    if ((where != end()) && !value_comp()(key, *where))
      return where;
    else
      return end();
  }